

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

double __thiscall logger::log(logger *this,double __x)

{
  char *pcVar1;
  ostream *poVar2;
  string *in_RDX;
  int in_ESI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  
  pcVar1 = levels[in_ESI];
  syslog(in_ESI,"[%s] %s",pcVar1,*(undefined8 *)in_RDX);
  if (this->ll < in_ESI) {
    return extraout_XMM0_Qa;
  }
  timestamp();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," [");
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,"]");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,in_RDX);
  std::endl<char,std::char_traits<char>>(poVar2);
  return extraout_XMM0_Qa_00;
}

Assistant:

void logger::log(int level, std::string const & msg) {
    syslog(level, "[%s] %s", levels[level], msg.c_str());
    if (level <= ll) {
        auto ts = timestamp();
        std::cerr << ts / 1000 << "." << ts % 1000 << " [" << levels[level] << "]" << " " << msg << std::endl;
    }
}